

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

SmallBuffer * __thiscall
helics::SmallBuffer::operator=
          (SmallBuffer *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  byte *__src;
  size_t size;
  
  __src = (byte *)(u->_M_dataplus)._M_p;
  size = u->_M_string_length;
  if (__src == this->heap) {
    this->bufferSize = size;
  }
  else {
    resize(this,size);
    if (size != 0) {
      memcpy(this->heap,__src,size);
    }
  }
  return this;
}

Assistant:

SmallBuffer& operator=(U&& u)
    {
        std::string_view val(std::forward<U>(u));
        if (reinterpret_cast<const std::byte*>(val.data()) == heap) {
            bufferSize = val.size();
            return *this;
        }
        resize(val.size());
        if (val.size() > 0) {
            std::memcpy(heap, val.data(), val.size());
        }
        return *this;
    }